

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexer.cpp
# Opt level: O2

void __thiscall Indexer::remove_dataset(Indexer *this,OnDiskDataset *dataset_ptr)

{
  OnDiskDataset *this_00;
  iterator __position;
  
  __position._M_current =
       (this->created_datasets).
       super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  while (__position._M_current !=
         (this->created_datasets).
         super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = ((__position._M_current)->_M_t).
              super___uniq_ptr_impl<OnDiskDataset,_std::default_delete<OnDiskDataset>_>._M_t.
              super__Tuple_impl<0UL,_OnDiskDataset_*,_std::default_delete<OnDiskDataset>_>.
              super__Head_base<0UL,_OnDiskDataset_*,_false>._M_head_impl;
    if (this_00 == dataset_ptr) {
      OnDiskDataset::drop(this_00);
      __position = std::
                   vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
                   ::erase(&this->created_datasets,(const_iterator)__position._M_current);
    }
    else {
      __position._M_current = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void Indexer::remove_dataset(const OnDiskDataset *dataset_ptr) {
    for (auto it = created_datasets.begin(); it != created_datasets.end();) {
        if ((*it).get() == dataset_ptr) {
            (*it)->drop();
            it = created_datasets.erase(it);
        } else {
            ++it;
        }
    }
}